

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

deUint32 tcu::astc::anon_unknown_0::bitReplicationScale(deUint32 src,int numSrcBits,int numDstBits)

{
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  int shift;
  deUint32 dst;
  int numDstBits_local;
  int numSrcBits_local;
  deUint32 src_local;
  
  local_18 = 0;
  for (local_1c = numDstBits - numSrcBits;
      local_1c != -numSrcBits && SBORROW4(local_1c,-numSrcBits) == local_1c + numSrcBits < 0;
      local_1c = local_1c - numSrcBits) {
    if (local_1c < 0) {
      local_20 = src >> (-(byte)local_1c & 0x1f);
    }
    else {
      local_20 = src << ((byte)local_1c & 0x1f);
    }
    local_18 = local_20 | local_18;
  }
  return local_18;
}

Assistant:

inline deUint32 bitReplicationScale (deUint32 src, int numSrcBits, int numDstBits)
{
	DE_ASSERT(numSrcBits <= numDstBits);
	DE_ASSERT((src & ((1<<numSrcBits)-1)) == src);
	deUint32 dst = 0;
	for (int shift = numDstBits-numSrcBits; shift > -numSrcBits; shift -= numSrcBits)
		dst |= shift >= 0 ? src << shift : src >> -shift;
	return dst;
}